

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O2

void __thiscall lest::confirm::~confirm(confirm *this)

{
  ostream *poVar1;
  text *this_00;
  allocator local_112;
  allocator local_111;
  long *local_110;
  undefined8 local_108;
  undefined1 local_100;
  uint7 uStack_ff;
  undefined8 uStack_f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_f0;
  size_type local_e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e0;
  long *local_d0;
  undefined8 local_c8;
  long local_c0;
  undefined8 uStack_b8;
  long *local_b0;
  undefined8 local_a8;
  long local_a0;
  undefined8 uStack_98;
  long *local_90;
  undefined8 local_88;
  long local_80;
  undefined8 uStack_78;
  text local_70;
  text local_50;
  text local_30;
  
  if (this->failures < 1) {
    if ((this->output).opt.pass != true) goto LAB_001069b4;
    poVar1 = std::operator<<((this->super_action).os,"All ");
    poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,this->selected);
    poVar1 = std::operator<<(poVar1," selected ");
    std::__cxx11::string::string((string *)&local_f0,"test",&local_111);
    local_50._M_string_length = local_e8;
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    if (local_f0 == &local_e0) {
      local_50.field_2._8_8_ = local_e0._8_8_;
    }
    else {
      local_50._M_dataplus._M_p = (pointer)local_f0;
    }
    local_e8 = 0;
    local_e0._M_local_buf[0] = '\0';
    local_f0 = &local_e0;
    pluralise(&local_70,&local_50,this->selected);
    poVar1 = std::operator<<(poVar1,(string *)&local_70);
    poVar1 = std::operator<<(poVar1," ");
    std::__cxx11::string::string((string *)&local_110,"passed.\n",&local_112);
    local_c8 = local_108;
    local_b0 = &local_a0;
    if (local_110 == (long *)&local_100) {
      uStack_98 = uStack_f8;
      local_110 = local_b0;
    }
    local_108 = 0;
    local_100 = 0;
    local_d0 = local_110;
    if (local_110 == local_b0) {
      uStack_b8 = uStack_98;
      local_d0 = &local_c0;
    }
    local_a8 = 0;
    local_a0 = (ulong)uStack_ff << 8;
    local_110 = (long *)&local_100;
    std::operator<<(poVar1,(string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_110);
    std::__cxx11::string::~string((string *)&local_70);
    this_00 = &local_50;
  }
  else {
    poVar1 = (ostream *)std::ostream::operator<<((ostream *)(this->super_action).os,this->failures);
    poVar1 = std::operator<<(poVar1," out of ");
    poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,this->selected);
    poVar1 = std::operator<<(poVar1," selected ");
    std::__cxx11::string::string((string *)&local_f0,"test",&local_111);
    local_30._M_string_length = local_e8;
    local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
    if (local_f0 == &local_e0) {
      local_30.field_2._8_8_ = local_e0._8_8_;
    }
    else {
      local_30._M_dataplus._M_p = (pointer)local_f0;
    }
    local_e8 = 0;
    local_e0._M_local_buf[0] = '\0';
    local_f0 = &local_e0;
    pluralise(&local_70,&local_30,this->selected);
    poVar1 = std::operator<<(poVar1,(string *)&local_70);
    poVar1 = std::operator<<(poVar1," ");
    std::__cxx11::string::string((string *)&local_110,"failed.\n",&local_112);
    local_c8 = local_108;
    local_90 = &local_80;
    if (local_110 == (long *)&local_100) {
      uStack_78 = uStack_f8;
      local_110 = local_90;
    }
    local_108 = 0;
    local_100 = 0;
    local_d0 = local_110;
    if (local_110 == local_90) {
      uStack_b8 = uStack_78;
      local_d0 = &local_c0;
    }
    local_88 = 0;
    local_80 = (ulong)uStack_ff << 8;
    local_110 = (long *)&local_100;
    std::operator<<(poVar1,(string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_110);
    std::__cxx11::string::~string((string *)&local_70);
    this_00 = &local_30;
  }
  std::__cxx11::string::~string((string *)this_00);
  std::__cxx11::string::~string((string *)&local_f0);
LAB_001069b4:
  env::~env(&this->output);
  return;
}

Assistant:

~confirm()
    {
        if ( failures > 0 )
        {
            os << failures << " out of " << selected << " selected " << pluralise("test", selected) << " " << colourise( "failed.\n" );
        }
        else if ( output.pass() )
        {
            os << "All " << selected << " selected " << pluralise("test", selected) << " " << colourise( "passed.\n" );
        }
    }